

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atexit.c
# Opt level: O1

void dumb_exit(void)

{
  DUMB_ATEXIT_PROC *pDVar1;
  
  if (dumb_atexit_proc != (DUMB_ATEXIT_PROC *)0x0) {
    do {
      pDVar1 = dumb_atexit_proc->next;
      (*dumb_atexit_proc->proc)();
      free(dumb_atexit_proc);
      dumb_atexit_proc = pDVar1;
    } while (pDVar1 != (DUMB_ATEXIT_PROC *)0x0);
    dumb_atexit_proc = (DUMB_ATEXIT_PROC *)0x0;
  }
  return;
}

Assistant:

void dumb_exit(void)
{
	while (dumb_atexit_proc) {
		DUMB_ATEXIT_PROC *next = dumb_atexit_proc->next;
		(*dumb_atexit_proc->proc)();
		free(dumb_atexit_proc);
		dumb_atexit_proc = next;
	}
}